

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O1

XmlNodePtr __thiscall libcellml::XmlNode::firstChild(XmlNode *this)

{
  XmlNode this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  undefined8 *in_RSI;
  XmlNode *__tmp;
  xmlNodePtr pxVar2;
  bool bVar3;
  XmlNodePtr XVar4;
  undefined1 local_69;
  XmlNode local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  string local_50;
  
  pxVar2 = *(xmlNodePtr *)(*(long *)*in_RSI + 0x18);
  this->mPimpl = (XmlNodeImpl *)0x0;
  this[1].mPimpl = (XmlNodeImpl *)0x0;
  if (pxVar2 != (xmlNodePtr)0x0) {
    this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this[1].mPimpl;
    do {
      local_68.mPimpl = (XmlNodeImpl *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<libcellml::XmlNode,std::allocator<libcellml::XmlNode>>
                (a_Stack_60,(XmlNode **)&local_68,(allocator<libcellml::XmlNode> *)&local_69);
      _Var1._M_pi = a_Stack_60[0]._M_pi;
      this_00.mPimpl = local_68.mPimpl;
      local_68.mPimpl = (XmlNodeImpl *)0x0;
      a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this->mPimpl = (XmlNodeImpl *)this_00;
      in_RDX._M_pi = extraout_RDX;
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        in_RDX._M_pi = extraout_RDX_00;
      }
      if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
        in_RDX._M_pi = extraout_RDX_01;
      }
      (this_00.mPimpl)->mXmlNodePtr->_private = pxVar2;
      bVar3 = true;
      if (pxVar2->type == XML_TEXT_NODE) {
        convertToStrippedString_abi_cxx11_(&local_50,(XmlNode *)this_00.mPimpl);
        bVar3 = local_50._M_string_length != 0;
        in_RDX._M_pi = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          in_RDX._M_pi = extraout_RDX_03;
        }
      }
      if (!bVar3) {
        pxVar2 = pxVar2->next;
      }
      this_01._M_pi = _Var1._M_pi;
    } while (!(bool)(bVar3 | pxVar2 == (xmlNodePtr)0x0));
    this[1].mPimpl = (XmlNodeImpl *)_Var1._M_pi;
  }
  XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (XmlNodePtr)XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlNode::firstChild() const
{
    xmlNodePtr child = mPimpl->mXmlNodePtr->children;
    XmlNodePtr childHandle = nullptr;
    while (child != nullptr) {
        childHandle = std::make_shared<XmlNode>();
        childHandle->setXmlNode(child);
        bool textNode = childHandle->isText();
        if (!textNode || !childHandle->convertToStrippedString().empty()) {
            break;
        }
        child = child->next;
    }
    return childHandle;
}